

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O3

void __thiscall BarrierTest_Arrive_Test::TestBody(BarrierTest_Arrive_Test *this)

{
  bool bVar1;
  barrier<yamc::detail::default_barrier_completion> barrier;
  barrier<yamc::detail::default_barrier_completion> local_90;
  
  local_90.init_count_ = 3;
  local_90.counter_ = 3;
  local_90.phase_ = 0;
  std::condition_variable::condition_variable(&local_90.cv_);
  local_90.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_90.mtx_.super___mutex_base._M_mutex._16_8_ = 0;
  local_90.mtx_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_90.mtx_.super___mutex_base._M_mutex.__align = 0;
  local_90.mtx_.super___mutex_base._M_mutex._8_8_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::barrier<yamc::detail::default_barrier_completion>::arrive(&local_90,1);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::barrier<yamc::detail::default_barrier_completion>::arrive(&local_90,2);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::barrier<yamc::detail::default_barrier_completion>::arrive(&local_90,3);
  }
  std::condition_variable::~condition_variable(&local_90.cv_);
  return;
}

Assistant:

TEST(BarrierTest, Arrive)
{
  yamc::barrier<> barrier{3};  // expected count=3
  EXPECT_NO_THROW((void)barrier.arrive());   // c=3->2
  EXPECT_NO_THROW((void)barrier.arrive(2));  // c=2->0, next phase
  EXPECT_NO_THROW((void)barrier.arrive(3));  // c=3->0, next phase
  // casting void to suppress "ignoring return value" warning
}